

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void unodb::test::detail::
     do_assert_result_eq<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
               (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *db,key_type key,value_view expected,char *file,int line)

{
  __extent_storage<18446744073709551615UL> _Var1;
  span<const_std::byte,_18446744073709551615UL> key_00;
  value_view expected_00;
  span<const_std::byte,_18446744073709551615UL> key_01;
  ostringstream local_1f0 [8];
  ostringstream msg;
  ios_base local_180 [264];
  undefined1 local_78 [8];
  get_result result;
  AssertHelper local_48;
  Message local_40;
  ScopedTrace local_31 [8];
  ScopedTrace trace;
  
  key_00._M_ptr = key._M_extent._M_extent_value;
  _Var1._M_extent_value = (size_t)expected._M_ptr;
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  key_00._M_extent._M_extent_value = _Var1._M_extent_value;
  unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)local_1f0,(ostream *)key._M_ptr,key_00);
  std::__cxx11::stringbuf::str();
  testing::ScopedTrace::ScopedTrace(local_31,file,line,(string *)local_78);
  if (local_78 !=
      (undefined1  [8])
      ((long)&result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_payload + 8)) {
    operator_delete((void *)local_78,
                    CONCAT71(result.
                             super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                             ._M_payload._M_value._M_extent._M_extent_value._1_7_,
                             result.
                             super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                             ._M_payload._M_value._M_extent._M_extent_value._0_1_) + 1);
  }
  _Var1._M_extent_value = key_00._M_ptr;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_internal((get_result *)local_78,db,(art_key_type)key);
  if (result.super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value._0_1_ == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"db.get did not find ",0x14);
    key_01._M_extent._M_extent_value = _Var1._M_extent_value;
    key_01._M_ptr = (pointer)key_00._M_ptr;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)&std::cerr,(ostream *)key._M_ptr,key_01);
    local_40.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_40,1);
    db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::dump(db,(ostream *)&std::cerr);
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x80,"Failed");
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)CONCAT71(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  else {
    expected_00._M_extent._M_extent_value = _Var1._M_extent_value;
    expected_00._M_ptr = (pointer)expected._M_extent._M_extent_value._M_extent_value;
    assert_value_eq<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)local_78,(get_result *)expected._M_ptr,expected_00);
  }
  testing::ScopedTrace::~ScopedTrace(local_31);
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  std::ios_base::~ios_base(local_180);
  return;
}

Assistant:

void do_assert_result_eq(const Db &db, typename Db::key_type key,
                         unodb::value_view expected, const char *file,
                         int line) {
  std::ostringstream msg;
  unodb::detail::dump_key(msg, key);
  const testing::ScopedTrace trace(file, line, msg.str());
  const auto result = db.get(key);
  if (!Db::key_found(result)) {
    // LCOV_EXCL_START
    std::cerr << "db.get did not find ";
    unodb::detail::dump_key(std::cerr, key);
    std::cerr << '\n';
    db.dump(std::cerr);
    FAIL();
    // LCOV_EXCL_STOP
  }
  assert_value_eq<Db>(result, expected);
}